

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

void __thiscall helics::FederateState::setTag(FederateState *this,string_view tag,string_view value)

{
  __atomic_flag_data_type _Var1;
  pointer ppVar2;
  pointer ppVar3;
  int iVar4;
  char *__s1;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type __rlen;
  bool bVar5;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_50._M_str = value._M_str;
  local_50._M_len = value._M_len;
  __s1 = tag._M_str;
  __n = tag._M_len;
  do {
    LOCK();
    _Var1 = (this->processing).super___atomic_flag_base._M_i;
    (this->processing).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var1 != false);
  ppVar2 = (this->tags).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->tags).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = ppVar2 == ppVar3;
  local_40._M_len = __n;
  local_40._M_str = __s1;
  if (!bVar5) {
    this_00 = &ppVar2->second;
    do {
      if ((__n == this_00[-1]._M_string_length) &&
         ((__n == 0 || (iVar4 = bcmp(__s1,this_00[-1]._M_dataplus._M_p,__n), iVar4 == 0)))) {
        LOCK();
        (this->processing).super___atomic_flag_base._M_i = false;
        UNLOCK();
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace(this_00,0,this_00->_M_string_length,local_50._M_str,local_50._M_len);
        if (!bVar5) {
          return;
        }
        break;
      }
      bVar5 = (pointer)(this_00 + 1) == ppVar3;
      this_00 = this_00 + 2;
    } while (!bVar5);
  }
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)&this->tags,&local_40,&local_50);
  LOCK();
  (this->processing).super___atomic_flag_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

void FederateState::setTag(std::string_view tag, std::string_view value)
{
    spinlock();
    for (auto& testTag : tags) {
        if (testTag.first == tag) {
            unlock();
            testTag.second = value;
            return;
        }
    }
    tags.emplace_back(tag, value);
    unlock();
}